

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfe.cpp
# Opt level: O0

string * to_string_abi_cxx11_(string *__return_storage_ptr__,FloppyInterfaceMode interface_mode)

{
  allocator<char> local_33;
  allocator<char> local_32;
  allocator<char> local_31;
  allocator<char> local_30;
  allocator<char> local_2f;
  allocator<char> local_2e;
  allocator<char> local_2d;
  allocator<char> local_2c;
  allocator<char> local_2b;
  allocator<char> local_2a;
  allocator<char> local_29;
  allocator<char> local_28;
  allocator<char> local_27;
  allocator<char> local_26;
  allocator<char> local_25 [16];
  allocator<char> local_15;
  FloppyInterfaceMode local_14;
  string *psStack_10;
  FloppyInterfaceMode interface_mode_local;
  
  local_14 = interface_mode;
  psStack_10 = __return_storage_ptr__;
  if (interface_mode == IBMPC_DD_FLOPPYMODE) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"IBMPC_DD_FLOPPYMODE",&local_15);
    std::allocator<char>::~allocator(&local_15);
  }
  else if (interface_mode == IBMPC_HD_FLOPPYMODE) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"IBMPC_HD_FLOPPYMODE",local_25);
    std::allocator<char>::~allocator(local_25);
  }
  else if (interface_mode == ATARIST_DD_FLOPPYMODE) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"ATARIST_DD_FLOPPYMODE",&local_26);
    std::allocator<char>::~allocator(&local_26);
  }
  else if (interface_mode == ATARIST_HD_FLOPPYMODE) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"ATARIST_HD_FLOPPYMODE",&local_27);
    std::allocator<char>::~allocator(&local_27);
  }
  else if (interface_mode == AMIGA_DD_FLOPPYMODE) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"AMIGA_DD_FLOPPYMODE",&local_28);
    std::allocator<char>::~allocator(&local_28);
  }
  else if (interface_mode == AMIGA_HD_FLOPPYMODE) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"AMIGA_HD_FLOPPYMODE",&local_29);
    std::allocator<char>::~allocator(&local_29);
  }
  else if (interface_mode == CPC_DD_FLOPPYMODE) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"CPC_DD_FLOPPYMODE",&local_2a);
    std::allocator<char>::~allocator(&local_2a);
  }
  else if (interface_mode == GENERIC_SHUGART_DD_FLOPPYMODE) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"GENERIC_SHUGART_DD_FLOPPYMODE",&local_2b);
    std::allocator<char>::~allocator(&local_2b);
  }
  else if (interface_mode == IBMPC_ED_FLOPPYMODE) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"IBMPC_ED_FLOPPYMODE",&local_2c);
    std::allocator<char>::~allocator(&local_2c);
  }
  else if (interface_mode == MSX2_DD_FLOPPYMODE) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"MSX2_DD_FLOPPYMODE",&local_2d);
    std::allocator<char>::~allocator(&local_2d);
  }
  else if (interface_mode == C64_DD_FLOPPYMODE) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"C64_DD_FLOPPYMODE",&local_2e);
    std::allocator<char>::~allocator(&local_2e);
  }
  else if (interface_mode == EMU_SHUGART_FLOPPYMODE) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"EMU_SHUGART_FLOPPYMODE",&local_2f);
    std::allocator<char>::~allocator(&local_2f);
  }
  else if (interface_mode == S950_DD_FLOPPYMODE) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"S950_DD_FLOPPYMODE",&local_30);
    std::allocator<char>::~allocator(&local_30);
  }
  else if (interface_mode == S950_HD_FLOPPYMODE) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"S950_HD_FLOPPYMODE",&local_31);
    std::allocator<char>::~allocator(&local_31);
  }
  else if (interface_mode == DISABLE_FLOPPYMODE) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"DISABLE_FLOPPYMODE",&local_32);
    std::allocator<char>::~allocator(&local_32);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Unknown",&local_33);
    std::allocator<char>::~allocator(&local_33);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(FloppyInterfaceMode interface_mode)
{
    switch (interface_mode)
    {
    case IBMPC_DD_FLOPPYMODE:   return "IBMPC_DD_FLOPPYMODE";   break;
    case IBMPC_HD_FLOPPYMODE:   return "IBMPC_HD_FLOPPYMODE";   break;
    case ATARIST_DD_FLOPPYMODE: return "ATARIST_DD_FLOPPYMODE"; break;
    case ATARIST_HD_FLOPPYMODE: return "ATARIST_HD_FLOPPYMODE"; break;
    case AMIGA_DD_FLOPPYMODE:   return "AMIGA_DD_FLOPPYMODE";   break;
    case AMIGA_HD_FLOPPYMODE:   return "AMIGA_HD_FLOPPYMODE";   break;
    case CPC_DD_FLOPPYMODE:     return "CPC_DD_FLOPPYMODE";     break;
    case GENERIC_SHUGART_DD_FLOPPYMODE: return "GENERIC_SHUGART_DD_FLOPPYMODE"; break;
    case IBMPC_ED_FLOPPYMODE:   return "IBMPC_ED_FLOPPYMODE";   break;
    case MSX2_DD_FLOPPYMODE:    return "MSX2_DD_FLOPPYMODE";    break;
    case C64_DD_FLOPPYMODE:     return "C64_DD_FLOPPYMODE";     break;
    case EMU_SHUGART_FLOPPYMODE:return "EMU_SHUGART_FLOPPYMODE"; break;
    case S950_DD_FLOPPYMODE:    return "S950_DD_FLOPPYMODE";    break;
    case S950_HD_FLOPPYMODE:    return "S950_HD_FLOPPYMODE";    break;
    case DISABLE_FLOPPYMODE:    return "DISABLE_FLOPPYMODE";    break;
    }
    return "Unknown";
}